

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::CoronaLoader::load(CoronaLoader *this,FileName *fileName,AffineSpace3fa *space)

{
  CoronaLoader loader;
  CoronaLoader CStack_c8;
  
  CoronaLoader(&CStack_c8,fileName,space);
  (this->path).filename._M_dataplus._M_p = (pointer)CStack_c8.root.ptr;
  if (CStack_c8.root.ptr != (Node *)0x0) {
    (*((CStack_c8.root.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  ~CoronaLoader(&CStack_c8);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> CoronaLoader::load(const FileName& fileName, const AffineSpace3fa& space) {
    CoronaLoader loader(fileName,space); return loader.root;
  }